

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secret.cpp
# Opt level: O1

void __thiscall
duckdb::KeyValueSecretReader::KeyValueSecretReader
          (KeyValueSecretReader *this,long *opener_p,long param_3,char **param_4,idx_t param_5)

{
  DatabaseInstance *pDVar1;
  ClientContext *pCVar2;
  long local_38;
  
  (this->context).ptr = (ClientContext *)0x0;
  (this->secret_entry).internal.super___shared_ptr<duckdb::SecretEntry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->db).ptr = (DatabaseInstance *)0x0;
  (this->secret).ptr = (KeyValueSecret *)0x0;
  (this->secret_entry).internal.super___shared_ptr<duckdb::SecretEntry,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->path)._M_dataplus._M_p = (pointer)&(this->path).field_2;
  (this->path)._M_string_length = 0;
  (this->path).field_2._M_local_buf[0] = '\0';
  local_38 = param_3;
  pDVar1 = (DatabaseInstance *)(**(code **)(*opener_p + 0x28))(opener_p);
  (this->db).ptr = pDVar1;
  pCVar2 = (ClientContext *)(**(code **)(*opener_p + 0x20))(opener_p);
  (this->context).ptr = pCVar2;
  if (local_38 != 0) {
    optional_ptr<duckdb::FileOpenerInfo,_true>::CheckValid
              ((optional_ptr<duckdb::FileOpenerInfo,_true> *)&local_38);
    ::std::__cxx11::string::_M_assign((string *)&this->path);
  }
  Initialize(this,param_4,param_5);
  return;
}

Assistant:

KeyValueSecretReader::KeyValueSecretReader(FileOpener &opener_p, optional_ptr<FileOpenerInfo> info,
                                           const char **secret_types, idx_t secret_types_len) {
	db = opener_p.TryGetDatabase();
	context = opener_p.TryGetClientContext();

	if (info) {
		path = info->file_path;
	}

	Initialize(secret_types, secret_types_len);
}